

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O1

bool __thiscall
cmCTestCurl::HttpRequest(cmCTestCurl *this,string *url,string *fields,string *response)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  CURLcode CVar4;
  ostream *poVar5;
  curl_slist *list;
  iterator __begin2;
  pointer pbVar6;
  string curlDebug;
  vector<char,_std::allocator<char>_> debugData;
  vector<char,_std::allocator<char>_> responseData;
  ostringstream cmCTestLog_msg;
  long *local_228;
  long local_220;
  long local_218 [2];
  void *local_208;
  void *pvStack_200;
  long local_1f8;
  string *local_1f0;
  void *local_1e8;
  void *pvStack_1e0;
  long local_1d8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  response->_M_string_length = 0;
  *(response->_M_dataplus)._M_p = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HttpRequest\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"url: ",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"fields ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(fields->_M_dataplus)._M_p,fields->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  pcVar1 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
               ,0xca,(char *)local_228,this->Quiet);
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  bVar3 = InitCurl(this);
  if (bVar3) {
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_POST,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_POSTFIELDS,(fields->_M_dataplus)._M_p);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_URL,(url->_M_dataplus)._M_p);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FOLLOWLOCATION,1);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEFUNCTION,
                     anon_unknown.dwarf_569426::curlWriteMemoryCallback);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGFUNCTION,
                     anon_unknown.dwarf_569426::curlDebugCallback);
    local_1d8 = 0;
    local_1e8 = (void *)0x0;
    pvStack_1e0 = (void *)0x0;
    local_1f8 = 0;
    local_208 = (void *)0x0;
    pvStack_200 = (void *)0x0;
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_WRITEDATA);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_DEBUGDATA,&local_208);
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_FAILONERROR,1);
    pbVar6 = (this->HttpHeaders).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->HttpHeaders).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    list = (curl_slist *)0x0;
    local_1f0 = response;
    if (pbVar6 != pbVar2) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"   Add HTTP Header: \"",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                     ,0xe3,(char *)local_228,this->Quiet);
        if (local_228 != local_218) {
          operator_delete(local_228,local_218[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        list = curl_slist_append(list,(pbVar6->_M_dataplus)._M_p);
        pbVar6 = pbVar6 + 1;
      } while (pbVar6 != pbVar2);
    }
    curl_easy_setopt((Curl_easy *)this->Curl,CURLOPT_HTTPHEADER,list);
    CVar4 = curl_easy_perform((Curl_easy *)this->Curl);
    curl_slist_free_all(list);
    if (local_1e8 != pvStack_1e0) {
      local_1a8._0_8_ = local_198;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)local_1a8);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Curl response: [",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1f0->_M_dataplus)._M_p,
                          local_1f0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xef,(char *)local_228,this->Quiet);
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if (local_208 != pvStack_200) {
      local_228 = local_218;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Curl debug: [",0xd);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_228,local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]\n",2);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                   ,0xf4,(char *)local_1c8,this->Quiet);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Curl res: ",10);
    poVar5 = (ostream *)std::ostream::operator<<(local_1a8,CVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xf7,(char *)local_228,this->Quiet);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar3 = CVar4 == CURLE_OK;
    if (local_208 != (void *)0x0) {
      operator_delete(local_208,local_1f8 - (long)local_208);
    }
    if (local_1e8 != (void *)0x0) {
      operator_delete(local_1e8,local_1d8 - (long)local_1e8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Initialization of curl failed\n",0x1e);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCurl.cxx"
                 ,0xcc,(char *)local_228,false);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmCTestCurl::HttpRequest(std::string const& url,
                              std::string const& fields, std::string& response)
{
  response.clear();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "HttpRequest\n"
                       << "url: " << url << "\n"
                       << "fields " << fields << "\n",
                     this->Quiet);
  if (!this->InitCurl()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Initialization of curl failed\n");
    return false;
  }
  curl_easy_setopt(this->Curl, CURLOPT_POST, 1);
  curl_easy_setopt(this->Curl, CURLOPT_POSTFIELDS, fields.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_URL, url.c_str());
  ::curl_easy_setopt(this->Curl, CURLOPT_FOLLOWLOCATION, 1);
  // set response options
  ::curl_easy_setopt(this->Curl, CURLOPT_WRITEFUNCTION,
                     curlWriteMemoryCallback);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGFUNCTION, curlDebugCallback);
  std::vector<char> responseData;
  std::vector<char> debugData;
  ::curl_easy_setopt(this->Curl, CURLOPT_FILE, &responseData);
  ::curl_easy_setopt(this->Curl, CURLOPT_DEBUGDATA, &debugData);
  ::curl_easy_setopt(this->Curl, CURLOPT_FAILONERROR, 1);

  // Add headers if any were specified.
  struct curl_slist* headers = nullptr;
  if (!this->HttpHeaders.empty()) {
    for (std::string const& h : this->HttpHeaders) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "   Add HTTP Header: \"" << h << "\"" << std::endl,
                         this->Quiet);
      headers = ::curl_slist_append(headers, h.c_str());
    }
  }

  ::curl_easy_setopt(this->Curl, CURLOPT_HTTPHEADER, headers);
  CURLcode res = ::curl_easy_perform(this->Curl);
  ::curl_slist_free_all(headers);

  if (!responseData.empty()) {
    response = std::string(responseData.begin(), responseData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl response: [" << response << "]\n", this->Quiet);
  }
  if (!debugData.empty()) {
    std::string curlDebug = std::string(debugData.begin(), debugData.end());
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Curl debug: [" << curlDebug << "]\n", this->Quiet);
  }
  cmCTestOptionalLog(this->CTest, DEBUG, "Curl res: " << res << "\n",
                     this->Quiet);
  return (res == 0);
}